

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Js::AsmJSByteCodeGenerator::EmitEmptyByteCode::AutoCleanup::~AutoCleanup(AutoCleanup *this)

{
  ByteCodeWriter *this_00;
  AutoCleanup *this_local;
  
  if (this->mFunctionBody != (FunctionBody *)0x0) {
    FunctionBody::ResetByteCodeGenState(this->mFunctionBody);
    this_00 = ByteCodeGenerator::Writer(this->mByteCodeGen);
    ByteCodeWriter::Reset(this_00);
  }
  return;
}

Assistant:

~AutoCleanup()
            {
                if (mFunctionBody)
                {
                    mFunctionBody->ResetByteCodeGenState();
                    mByteCodeGen->Writer()->Reset();
                }
            }